

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<false,false,true>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer::
visitLocalGet(wasm::LocalGet__(void *this,LocalGet *curr)

{
  Index index_00;
  LocalGet **this_00;
  Index IVar1;
  bool bVar2;
  value_type vVar3;
  value_type vVar4;
  Function *this_01;
  reference puVar5;
  reference pvVar6;
  Type TVar7;
  bool hasMoreGets;
  Type local_90;
  Type oldType;
  Type bestType;
  Type local_70;
  Type addressType;
  Type bestType_1;
  iterator iStack_58;
  uint index;
  iterator __end4;
  iterator __begin4;
  Set *__range4;
  Index best;
  Function *func;
  anon_class_16_2_3fdeafed getNumGetsIgnoringCurr;
  Set *set;
  LocalGet *curr_local;
  EquivalentOptimizer *this_local;
  
  set = (Set *)curr;
  curr_local = (LocalGet *)this;
  getNumGetsIgnoringCurr.curr =
       (LocalGet **)
       EquivalentSets::getEquivalents((EquivalentSets *)((long)this + 0x1b0),curr->index);
  if ((Set *)getNumGetsIgnoringCurr.curr != (Set *)0x0) {
    getNumGetsIgnoringCurr.this = (EquivalentOptimizer *)&set;
    func = (Function *)this;
    this_01 = Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::getFunction
                        ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)
                         this);
    this_00 = getNumGetsIgnoringCurr.curr;
    __range4._4_4_ = 0xffffffff;
    __end4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )getNumGetsIgnoringCurr.curr);
    iStack_58 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)this_00);
    while (bVar2 = std::operator!=(&__end4,&stack0xffffffffffffffa8), bVar2) {
      puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end4);
      index_00 = *puVar5;
      IVar1 = index_00;
      if (__range4._4_4_ != 0xffffffff) {
        addressType = Function::getLocalType(this_01,__range4._4_4_);
        local_70 = Function::getLocalType(this_01,index_00);
        bVar2 = wasm::Type::isSubType(local_70,addressType);
        IVar1 = __range4._4_4_;
        if (bVar2) {
          bVar2 = wasm::Type::operator!=(&local_70,&addressType);
          if (!bVar2) {
            vVar3 = SimplifyLocals<false,_false,_true>::runLateOptimizations::EquivalentOptimizer::
                    visitLocalGet::anon_class_16_2_3fdeafed::operator()
                              ((anon_class_16_2_3fdeafed *)&func,index_00);
            vVar4 = SimplifyLocals<false,_false,_true>::runLateOptimizations::EquivalentOptimizer::
                    visitLocalGet::anon_class_16_2_3fdeafed::operator()
                              ((anon_class_16_2_3fdeafed *)&func,__range4._4_4_);
            if (vVar3 <= vVar4) goto LAB_0226f610;
          }
          IVar1 = index_00;
        }
      }
LAB_0226f610:
      __range4._4_4_ = IVar1;
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end4);
    }
    if (__range4._4_4_ == 0xffffffff) {
      __assert_fail("best != Index(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x450,
                    "void wasm::SimplifyLocals<false, false>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *) [allowTee = false, allowStructure = false, allowNesting = true]"
                   );
    }
    oldType = Function::getLocalType(this_01,__range4._4_4_);
    local_90 = Function::getLocalType
                         (this_01,*(Index *)&(set->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent);
    if ((__range4._4_4_ != *(Index *)&(set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
       && (bVar2 = wasm::Type::isSubType(oldType,local_90), bVar2)) {
      vVar3 = SimplifyLocals<false,_false,_true>::runLateOptimizations::EquivalentOptimizer::
              visitLocalGet::anon_class_16_2_3fdeafed::operator()
                        ((anon_class_16_2_3fdeafed *)&func,__range4._4_4_);
      vVar4 = SimplifyLocals<false,_false,_true>::runLateOptimizations::EquivalentOptimizer::
              visitLocalGet::anon_class_16_2_3fdeafed::operator()
                        ((anon_class_16_2_3fdeafed *)&func,
                         *(Index *)&(set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent);
      if ((vVar4 < vVar3) || (bVar2 = wasm::Type::operator!=(&oldType,&local_90), bVar2)) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                             ((long)this + 0xe0),(ulong)__range4._4_4_);
        *pvVar6 = *pvVar6 + 1;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                             ((long)this + 0xe0),
                            (ulong)*(uint *)&(set->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent);
        if (*pvVar6 == 0) {
          __assert_fail("(*numLocalGets)[curr->index] >= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x45d,
                        "void wasm::SimplifyLocals<false, false>::runLateOptimizations(Function *)::EquivalentOptimizer::visitLocalGet(LocalGet *) [allowTee = false, allowStructure = false, allowNesting = true]"
                       );
        }
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                             ((long)this + 0xe0),
                            (ulong)*(uint *)&(set->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent);
        *pvVar6 = *pvVar6 - 1;
        *(Index *)&(set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = __range4._4_4_;
        *(undefined1 *)((long)this + 0x1a8) = 1;
        bVar2 = wasm::Type::operator!=(&oldType,&local_90);
        if (bVar2) {
          TVar7 = Function::getLocalType(this_01,__range4._4_4_);
          *(uintptr_t *)&(set->_M_t)._M_impl.super__Rb_tree_header._M_header = TVar7.id;
          *(undefined1 *)((long)this + 0x1a9) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
        // Canonicalize gets: if some are equivalent, then we can pick more
        // then one, and other passes may benefit from having more uniformity.
        if (auto* set = equivalences.getEquivalents(curr->index)) {
          // Helper method that returns the # of gets *ignoring the current
          // get*, as we want to see what is best overall, treating this one as
          // to be decided upon.
          auto getNumGetsIgnoringCurr = [&](Index index) {
            auto ret = (*numLocalGets)[index];
            if (index == curr->index) {
              assert(ret >= 1);
              ret--;
            }
            return ret;
          };

          // Pick the index with the most uses - maximizing the chance to
          // lower one's uses to zero. If types differ though then we prefer to
          // switch to a more refined type even if there are fewer uses, as that
          // may have significant benefits to later optimizations (we may be
          // able to use it to remove casts, etc.).
          auto* func = this->getFunction();
          Index best = -1;
          for (auto index : *set) {
            if (best == Index(-1)) {
              // This is the first possible option we've seen.
              best = index;
              continue;
            }

            auto bestType = func->getLocalType(best);
            auto addressType = func->getLocalType(index);
            if (!Type::isSubType(addressType, bestType)) {
              // This is less refined than the current best; ignore.
              continue;
            }

            // This is better if it has a more refined type, or if it has more
            // uses.
            if (addressType != bestType ||
                getNumGetsIgnoringCurr(index) > getNumGetsIgnoringCurr(best)) {
              best = index;
            }
          }
          assert(best != Index(-1));
          // Due to ordering, the best index may be different from us but have
          // the same # of locals - make sure we actually improve, either adding
          // more gets, or a more refined type (and never change to a less
          // refined type).
          auto bestType = func->getLocalType(best);
          auto oldType = func->getLocalType(curr->index);
          if (best != curr->index && Type::isSubType(bestType, oldType)) {
            auto hasMoreGets = getNumGetsIgnoringCurr(best) >
                               getNumGetsIgnoringCurr(curr->index);
            if (hasMoreGets || bestType != oldType) {
              // Update the get counts.
              (*numLocalGets)[best]++;
              assert((*numLocalGets)[curr->index] >= 1);
              (*numLocalGets)[curr->index]--;
              // Make the change.
              curr->index = best;
              anotherCycle = true;
              if (bestType != oldType) {
                curr->type = func->getLocalType(best);
                // We are switching to a more refined type, which might require
                // changes in the user of the local.get.
                refinalize = true;
              }
            }
          }
        }
      }